

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaBasicItemPtr
xmlSchemaParseElement
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int *isElemRef,
          int topLevel)

{
  xmlNodePtr *flags;
  byte *pbVar1;
  long *plVar2;
  xmlSchemaBucketPtr_conflict pxVar3;
  _xmlAttr *p_Var4;
  bool bVar5;
  undefined1 auVar6 [8];
  _xmlSchemaType *refNs_00;
  int iVar7;
  uint uVar8;
  int iVar9;
  _xmlSchemaType *p_Var10;
  xmlNodePtr pxVar11;
  xmlSchemaTreeItemPtr pxVar12;
  xmlSchemaTypePtr attr;
  xmlAttrPtr attr_00;
  xmlSchemaQNameRefPtr pxVar13;
  xmlSchemaParticlePtr __s;
  xmlSchemaTreeItemPtr *ppxVar14;
  xmlAttrPtr pxVar15;
  xmlSchemaTreeItemPtr pxVar16;
  xmlSchemaTypePtr pxVar17;
  xmlNodePtr pxVar18;
  xmlNodePtr pxVar19;
  xmlNs *pxVar20;
  xmlSchemaAnnotPtr pxVar21;
  _xmlNode *p_Var22;
  int *piVar23;
  _xmlSchemaType *attr_01;
  xmlSchemaParticlePtr pxVar24;
  xmlNodePtr pxVar25;
  xmlChar *name_00;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar26;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlChar *name_01;
  xmlChar *extraout_RDX_04;
  xmlChar *extraout_RDX_05;
  xmlChar *pxVar27;
  long *plVar28;
  xmlSchemaParserCtxtPtr pxVar29;
  xmlParserErrors error;
  char *str2;
  xmlSchemaItemListPtr *list;
  undefined4 in_register_00000084;
  char *child;
  xmlSchemaTreeItemPtr *in_R9;
  xmlChar **uri;
  char *uri_00;
  xmlDictPtr pxVar30;
  xmlChar *name;
  xmlChar *refNs;
  xmlChar **in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  xmlChar *in_stack_ffffffffffffff58;
  xmlSchemaParserCtxtPtr pxVar31;
  xmlSchemaPtr local_98;
  xmlSchemaParticlePtr local_58;
  _xmlSchemaType *local_50;
  undefined1 local_48 [8];
  _xmlSchemaType *local_40;
  _xmlSchemaType *local_38;
  
  child = (char *)CONCAT44(in_register_00000084,topLevel);
  if (isElemRef != (int *)0x0) {
    *isElemRef = 0;
  }
  piVar23 = isElemRef;
  p_Var10 = (_xmlSchemaType *)xmlSchemaGetPropNode(node,"name");
  pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
  if (p_Var10 == (_xmlSchemaType *)0x0 && (pxVar11 == (xmlNodePtr)0x0 || topLevel != 0)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1cc014,
               (xmlNodePtr)
               CONCAT71((int7)((ulong)piVar23 >> 8),pxVar11 == (xmlNodePtr)0x0 || topLevel != 0),
               child,(char *)in_R9);
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  xmlSchemaPValAttrID(ctxt,node,name_00);
  local_98 = (xmlSchemaPtr)node->children;
  if (local_98 == (xmlSchemaPtr)0x0) {
    local_98 = (xmlSchemaPtr)0x0;
LAB_0019892a:
    pxVar12 = (xmlSchemaTreeItemPtr)0x0;
  }
  else {
    if ((((xmlNs *)local_98->attrgrpDecl == (xmlNs *)0x0) ||
        (iVar7 = xmlStrEqual(local_98->version,(xmlChar *)"annotation"), iVar7 == 0)) ||
       (iVar7 = xmlStrEqual(((xmlNs *)local_98->attrgrpDecl)->href,
                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
    goto LAB_0019892a;
    pxVar12 = (xmlSchemaTreeItemPtr)xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)local_98,1);
    local_98 = *(xmlSchemaPtr *)&local_98->flags;
  }
  pxVar31 = ctxt;
  if (topLevel == 0) {
    uVar8 = xmlGetMinOccurs(ctxt,node,-1,0x1e3c53,(int)child,(char *)in_R9);
    child = "(xs:nonNegativeInteger | unbounded)";
    iVar7 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x1e3c69,(char *)in_R9);
    xmlSchemaPCheckParticleCorrect_2
              (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar8,iVar7,(int)child);
    local_58 = xmlSchemaAddParticle(ctxt,node,uVar8,iVar7);
    if (local_58 == (xmlSchemaParticlePtr)0x0) {
      if (pxVar12 == (xmlSchemaTreeItemPtr)0x0) {
        return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
      }
      goto LAB_00198bfa;
    }
    if (pxVar11 == (xmlNodePtr)0x0) goto LAB_0019893d;
    local_40 = (_xmlSchemaType *)0x0;
    local_48 = (undefined1  [8])0x0;
    if (isElemRef != (int *)0x0) {
      *isElemRef = 1;
    }
    pxVar29 = pxVar31;
    attr_00 = (xmlAttrPtr)xmlSchemaGetNodeContent(pxVar31,pxVar11);
    pxVar15 = (xmlAttrPtr)&stack0xffffffffffffffc0;
    uri = (xmlChar **)local_48;
    xmlSchemaPValAttrNodeQNameValue
              (pxVar31,schema,(xmlSchemaBasicItemPtr)pxVar11,attr_00,(xmlChar *)pxVar15,uri,
               in_stack_ffffffffffffff48);
    refNs_00 = local_40;
    attr_01 = local_40;
    xmlSchemaCheckReference
              (pxVar31,(xmlSchemaPtr)node,pxVar11,(xmlAttrPtr)local_40,(xmlChar *)pxVar15);
    if (p_Var10 != (_xmlSchemaType *)0x0) {
      pxVar15 = (xmlAttrPtr)0x1e1cd5;
      uri = (xmlChar **)0x1cc014;
      xmlSchemaPMutualExclAttrErr
                (pxVar31,XML_SCHEMAP_SRC_ELEMENT_2_1,(xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)p_Var10,
                 "ref","name");
      attr_01 = p_Var10;
    }
    for (p_Var4 = node->properties; p_Var4 != (_xmlAttr *)0x0; p_Var4 = p_Var4->next) {
      if (p_Var4->ns == (xmlNs *)0x0) {
        iVar9 = xmlStrEqual(p_Var4->name,"ref");
        if (((iVar9 == 0) && (iVar9 = xmlStrEqual(p_Var4->name,"name"), iVar9 == 0)) &&
           ((iVar9 = xmlStrEqual(p_Var4->name,"id"), iVar9 == 0 &&
            ((iVar9 = xmlStrEqual(p_Var4->name,(xmlChar *)"maxOccurs"), iVar9 == 0 &&
             (iVar9 = xmlStrEqual(p_Var4->name,(xmlChar *)"minOccurs"), iVar9 == 0)))))) {
          xmlSchemaPCustomAttrErr
                    (pxVar29,XML_SCHEMAP_SRC_ELEMENT_2_2,(xmlChar **)p_Var4,
                     (xmlSchemaBasicItemPtr)
                     "Only the attributes \'minOccurs\', \'maxOccurs\' and \'id\' are allowed in addition to \'ref\'"
                     ,pxVar15,(char *)uri);
          break;
        }
      }
      else {
        iVar9 = xmlStrEqual(p_Var4->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar9 != 0) {
          xmlSchemaPIllegalAttrErr(pxVar29,(xmlParserErrors)p_Var4,ownerComp,(xmlAttrPtr)attr_01);
        }
      }
    }
    if (local_98 != (xmlSchemaPtr)0x0) {
      xmlSchemaPContentErr
                (pxVar29,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                 (xmlNodePtr)local_98,(xmlNodePtr)0x0,"(annotation?)",
                 (char *)in_stack_ffffffffffffff48);
    }
    if ((iVar7 != 0 || uVar8 != 0) &&
       (pxVar13 = xmlSchemaNewQNameRef
                            (pxVar29,XML_SCHEMA_TYPE_ELEMENT,(xmlChar *)local_48,(xmlChar *)refNs_00
                            ), pxVar13 != (xmlSchemaQNameRefPtr)0x0)) {
      local_58->children = (xmlSchemaTreeItemPtr_conflict)pxVar13;
      local_58->annot = (xmlSchemaAnnotPtr)pxVar12;
      iVar7 = xmlSchemaAddItemSize(&pxVar29->constructor->pending,10,local_58);
      if (-1 < iVar7) {
        return (xmlSchemaBasicItemPtr)local_58;
      }
      xmlSchemaPErrMemory(pxVar29);
      return (xmlSchemaBasicItemPtr)local_58;
    }
  }
  else {
    local_58 = (xmlSchemaParticlePtr)0x0;
LAB_0019893d:
    attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    pxVar17 = (xmlSchemaTypePtr)local_48;
    iVar7 = xmlSchemaPValAttrNode
                      (pxVar31,(xmlSchemaBasicItemPtr)p_Var10,(xmlAttrPtr)attr,pxVar17,
                       (xmlChar **)child);
    if (iVar7 == 0) {
      if (topLevel == 0) {
        pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"form");
        pxVar29 = pxVar31;
        if (pxVar11 == (xmlNodePtr)0x0) {
          if ((schema->flags & 1) != 0) goto LAB_00198bdf;
          pxVar27 = (xmlChar *)0x0;
          uri_00 = (char *)in_R9;
        }
        else {
          uri_00 = (char *)xmlSchemaGetNodeContent(pxVar31,pxVar11);
          iVar7 = xmlStrEqual((xmlChar *)uri_00,"qualified");
          if (iVar7 == 0) {
            iVar7 = xmlStrEqual((xmlChar *)uri_00,(xmlChar *)"unqualified");
            if (iVar7 == 0) {
              in_stack_ffffffffffffff48 = (xmlChar **)0x0;
              in_stack_ffffffffffffff50 = 0;
              child = "(qualified | unqualified)";
              pxVar27 = (xmlChar *)0x0;
              pxVar17 = (xmlSchemaTypePtr)0x0;
              xmlSchemaPSimpleTypeErr
                        (pxVar29,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                         (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",uri_00,
                         (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff58,(xmlChar *)pxVar29);
            }
            else {
              pxVar27 = (xmlChar *)0x0;
              uri_00 = (char *)in_R9;
            }
          }
          else {
            pxVar27 = pxVar31->targetNamespace;
            uri_00 = (char *)in_R9;
          }
        }
      }
      else {
LAB_00198bdf:
        pxVar27 = pxVar31->targetNamespace;
        uri_00 = (char *)in_R9;
        pxVar29 = pxVar31;
      }
      auVar6 = local_48;
      if (local_48 != (undefined1  [8])0x0) {
        __s = (xmlSchemaParticlePtr)(*xmlMalloc)(200);
        if (__s == (xmlSchemaParticlePtr)0x0) {
          xmlSchemaPErrMemory(pxVar29);
        }
        else {
          memset(__s,0,200);
          __s->type = XML_SCHEMA_TYPE_ELEMENT;
          __s->next = (xmlSchemaTreeItemPtr_conflict)auVar6;
          *(xmlChar **)(__s + 2) = pxVar27;
          __s[1].children = (xmlSchemaTreeItemPtr_conflict)node;
          pxVar3 = pxVar29->constructor->bucket;
          if (topLevel == 0) {
            list = &pxVar3->locals;
            iVar7 = 10;
          }
          else {
            list = &pxVar3->globals;
            iVar7 = 5;
          }
          iVar7 = xmlSchemaAddItemSize(list,iVar7,__s);
          if (-1 < iVar7) {
            iVar7 = xmlSchemaAddItemSize(&pxVar29->constructor->pending,10,__s);
            if (iVar7 < 0) {
              xmlSchemaPErrMemory(pxVar29);
            }
            iVar7 = (int)in_stack_ffffffffffffff50;
            for (p_Var4 = node->properties; p_Var4 != (_xmlAttr *)0x0; p_Var4 = p_Var4->next) {
              if (p_Var4->ns == (xmlNs *)0x0) {
                iVar7 = xmlStrEqual(p_Var4->name,"name");
                if ((((((iVar7 == 0) && (iVar7 = xmlStrEqual(p_Var4->name,"type"), iVar7 == 0)) &&
                      (iVar7 = xmlStrEqual(p_Var4->name,"id"), iVar7 == 0)) &&
                     ((iVar7 = xmlStrEqual(p_Var4->name,"default"), iVar7 == 0 &&
                      (iVar7 = xmlStrEqual(p_Var4->name,(xmlChar *)"fixed"), iVar7 == 0)))) &&
                    (iVar7 = xmlStrEqual(p_Var4->name,(xmlChar *)"block"), iVar7 == 0)) &&
                   (iVar7 = xmlStrEqual(p_Var4->name,(xmlChar *)"nillable"), iVar7 == 0)) {
                  if (topLevel == 0) {
                    iVar7 = xmlStrEqual(p_Var4->name,(xmlChar *)"maxOccurs");
                    if ((iVar7 == 0) &&
                       (iVar7 = xmlStrEqual(p_Var4->name,(xmlChar *)"minOccurs"), iVar7 == 0)) {
                      pxVar27 = p_Var4->name;
                      str2 = "form";
                      goto LAB_00198f10;
                    }
                  }
                  else {
                    iVar7 = xmlStrEqual(p_Var4->name,(xmlChar *)"final");
                    if ((iVar7 == 0) && (iVar7 = xmlStrEqual(p_Var4->name,"abstract"), iVar7 == 0))
                    {
                      pxVar27 = p_Var4->name;
                      str2 = "substitutionGroup";
LAB_00198f10:
                      iVar7 = xmlStrEqual(pxVar27,(xmlChar *)str2);
                      pxVar26 = extraout_RDX_00;
                      if (iVar7 == 0) goto LAB_00198e04;
                    }
                  }
                }
              }
              else {
                iVar7 = xmlStrEqual(p_Var4->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
                pxVar26 = extraout_RDX;
                if (iVar7 != 0) {
LAB_00198e04:
                  xmlSchemaPIllegalAttrErr
                            (pxVar29,(xmlParserErrors)p_Var4,pxVar26,(xmlAttrPtr)pxVar17);
                }
              }
              iVar7 = (int)in_stack_ffffffffffffff50;
            }
            pxVar31 = pxVar29;
            if (topLevel != 0) {
              *(byte *)&__s[1].node = *(byte *)&__s[1].node | 0x22;
              flags = &__s[1].node;
              child = (char *)&__s[2].minOccurs;
              uri_00 = (char *)&__s[2].children;
              iVar9 = 0x1e45b2;
              xmlSchemaPValAttrQName
                        (pxVar29,schema,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)"substitutionGroup",
                         child,(xmlChar **)uri_00,in_stack_ffffffffffffff48);
              iVar9 = xmlGetBooleanProp(pxVar29,node,"abstract",iVar9);
              if (iVar9 != 0) {
                *(byte *)flags = *(byte *)flags | 0x10;
              }
              pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"final");
              if (pxVar11 == (xmlNodePtr)0x0) {
                uVar8 = schema->flags;
                if ((uVar8 & 4) != 0) {
                  pbVar1 = (byte *)((long)&__s[1].node + 1);
                  *pbVar1 = *pbVar1 | 0x80;
                }
                if ((uVar8 & 8) != 0) {
                  pbVar1 = (byte *)((long)&__s[1].node + 2);
                  *pbVar1 = *pbVar1 | 1;
                }
              }
              else {
                ppxVar14 = (xmlSchemaTreeItemPtr *)xmlSchemaGetNodeContent(pxVar31,pxVar11);
                in_stack_ffffffffffffff48 =
                     (xmlChar **)
                     CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0xffffffff);
                child = (char *)0xffffffff;
                uri_00 = (char *)0xffffffff;
                iVar9 = xmlSchemaPValAttrBlockFinal
                                  ((xmlChar *)ppxVar14,(int *)flags,0x8000,0x10000,-1,-1,-1,iVar7);
                if (iVar9 != 0) {
                  in_stack_ffffffffffffff48 = (xmlChar **)0x0;
                  iVar7 = 0;
                  child = "(#all | List of (extension | restriction))";
                  xmlSchemaPSimpleTypeErr
                            (pxVar31,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                             (xmlSchemaBasicItemPtr)pxVar11,(xmlNodePtr)0x0,
                             (xmlSchemaTypePtr)"(#all | List of (extension | restriction))",
                             (char *)ppxVar14,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff58,
                             (xmlChar *)pxVar31);
                  uri_00 = (char *)ppxVar14;
                }
              }
            }
            pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"block");
            pxVar29 = pxVar31;
            if (pxVar11 == (xmlNodePtr)0x0) {
              uVar8 = schema->flags;
              if ((char)uVar8 < '\0') {
                pbVar1 = (byte *)((long)&__s[1].node + 1);
                *pbVar1 = *pbVar1 | 0x10;
              }
              if ((uVar8 & 0x40) != 0) {
                pbVar1 = (byte *)((long)&__s[1].node + 1);
                *pbVar1 = *pbVar1 | 8;
              }
              pxVar24 = __s;
              if ((uVar8 >> 8 & 1) != 0) {
                pbVar1 = (byte *)((long)&__s[1].node + 1);
                *pbVar1 = *pbVar1 | 0x20;
              }
            }
            else {
              ppxVar14 = (xmlSchemaTreeItemPtr *)xmlSchemaGetNodeContent(pxVar31,pxVar11);
              in_stack_ffffffffffffff48 =
                   (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0xffffffff);
              pxVar24 = (xmlSchemaParticlePtr)0x1000;
              child = (char *)0x2000;
              uri_00 = (char *)0xffffffff;
              iVar7 = xmlSchemaPValAttrBlockFinal
                                ((xmlChar *)ppxVar14,(int *)&__s[1].node,0x800,0x1000,0x2000,-1,-1,
                                 iVar7);
              if (iVar7 != 0) {
                in_stack_ffffffffffffff48 = (xmlChar **)0x0;
                child = "(#all | List of (extension | restriction | substitution))";
                pxVar24 = (xmlSchemaParticlePtr)0x0;
                xmlSchemaPSimpleTypeErr
                          (pxVar31,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11
                           ,(xmlNodePtr)0x0,
                           (xmlSchemaTypePtr)
                           "(#all | List of (extension | restriction | substitution))",
                           (char *)ppxVar14,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff58,
                           (xmlChar *)pxVar29);
                uri_00 = (char *)ppxVar14;
              }
            }
            iVar7 = xmlGetBooleanProp(pxVar31,node,"nillable",(int)pxVar24);
            if (iVar7 != 0) {
              *(byte *)&__s[1].node = *(byte *)&__s[1].node | 1;
            }
            pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"type");
            pxVar31 = pxVar29;
            if (pxVar11 != (xmlNodePtr)0x0) {
              child = (char *)&__s[2].next;
              uri_00 = (char *)&__s[2].annot;
              pxVar15 = (xmlAttrPtr)xmlSchemaGetNodeContent(pxVar29,pxVar11);
              xmlSchemaPValAttrNodeQNameValue
                        (pxVar29,schema,(xmlSchemaBasicItemPtr)pxVar11,pxVar15,(xmlChar *)child,
                         (xmlChar **)uri_00,in_stack_ffffffffffffff48);
              xmlSchemaCheckReference
                        (pxVar29,(xmlSchemaPtr)node,pxVar11,(xmlAttrPtr)__s[2].next,(xmlChar *)child
                        );
            }
            pxVar16 = (xmlSchemaTreeItemPtr)xmlSchemaGetProp(pxVar29,node,"default");
            *(xmlSchemaTreeItemPtr *)(__s + 3) = pxVar16;
            pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"fixed");
            pxVar29 = pxVar31;
            if (pxVar11 != (xmlNodePtr)0x0) {
              pxVar16 = (xmlSchemaTreeItemPtr)xmlSchemaGetNodeContent(pxVar31,pxVar11);
              if (*(xmlSchemaTreeItemPtr *)(__s + 3) == (xmlSchemaTreeItemPtr)0x0) {
                *(byte *)&__s[1].node = *(byte *)&__s[1].node | 8;
                *(xmlSchemaTreeItemPtr *)(__s + 3) = pxVar16;
              }
              else {
                child = "default";
                uri_00 = "fixed";
                xmlSchemaPMutualExclAttrErr
                          (pxVar31,XML_SCHEMAP_SRC_ELEMENT_1,(xmlSchemaBasicItemPtr)0x0,
                           (xmlAttrPtr)pxVar11,"default","fixed");
              }
            }
            if (local_98 == (xmlSchemaPtr)0x0) goto LAB_001999f0;
            pxVar31 = pxVar29;
            if (local_98->attrgrpDecl != (xmlHashTablePtr)0x0) {
              iVar7 = xmlStrEqual(local_98->version,(xmlChar *)"complexType");
              if ((iVar7 == 0) ||
                 (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)) {
                if ((local_98->attrgrpDecl != (xmlHashTablePtr)0x0) &&
                   ((iVar7 = xmlStrEqual(local_98->version,"simpleType"), iVar7 != 0 &&
                    (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                         (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0)
                    ))) {
                  if (__s[2].annot == (xmlSchemaAnnotPtr)0x0) {
                    pxVar17 = xmlSchemaParseSimpleType(pxVar29,schema,(xmlNodePtr)local_98,0);
                    goto LAB_001992d3;
                  }
                  child = "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                  ;
                  goto LAB_00199293;
                }
              }
              else {
                if (__s[2].annot == (xmlSchemaAnnotPtr)0x0) {
                  pxVar17 = xmlSchemaParseComplexType(pxVar29,schema,(xmlNodePtr)local_98,0);
LAB_001992d3:
                  __s[1].annot = (xmlSchemaAnnotPtr)pxVar17;
                }
                else {
                  child = 
                  "The attribute \'type\' and the <complexType> child are mutually exclusive";
LAB_00199293:
                  uri_00 = (char *)0x0;
                  xmlSchemaPContentErr
                            (pxVar29,XML_SCHEMAP_SRC_ELEMENT_3,(xmlSchemaBasicItemPtr)node,
                             (xmlNodePtr)local_98,(xmlNodePtr)child,(char *)0x0,
                             (char *)in_stack_ffffffffffffff48);
                }
                local_98 = *(xmlSchemaPtr *)&local_98->flags;
                if (local_98 == (xmlSchemaPtr)0x0) goto LAB_001999f0;
              }
            }
            pxVar11 = (xmlNodePtr)0x0;
            do {
              if ((local_98->attrgrpDecl == (xmlHashTablePtr)0x0) ||
                 (((iVar7 = xmlStrEqual(local_98->version,(xmlChar *)"unique"), iVar7 == 0 ||
                   (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
                  && ((local_98->attrgrpDecl == (xmlHashTablePtr)0x0 ||
                      (((iVar7 = xmlStrEqual(local_98->version,(xmlChar *)"key"), iVar7 == 0 ||
                        (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                             (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                        iVar7 == 0)) &&
                       ((local_98->attrgrpDecl == (xmlHashTablePtr)0x0 ||
                        ((iVar7 = xmlStrEqual(local_98->version,"keyref"), iVar7 == 0 ||
                         (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                              (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                         iVar7 == 0)))))))))))) {
                xmlSchemaPContentErr
                          (pxVar29,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                           (xmlNodePtr)local_98,(xmlNodePtr)0x0,
                           "(annotation?, ((simpleType | complexType)?, (unique | key | keyref)*))",
                           (char *)in_stack_ffffffffffffff48);
                break;
              }
              pxVar25 = pxVar11;
              if (local_98->attrgrpDecl != (xmlHashTablePtr)0x0) {
                pxVar18 = pxVar11;
                iVar7 = xmlStrEqual(local_98->version,(xmlChar *)"unique");
                if ((iVar7 == 0) ||
                   (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
                {
                  if (local_98->attrgrpDecl == (xmlHashTablePtr)0x0) goto LAB_001996f9;
                  pxVar18 = pxVar11;
                  iVar7 = xmlStrEqual(local_98->version,(xmlChar *)"key");
                  if ((iVar7 != 0) &&
                     (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0
                     )) {
                    local_50._0_4_ = XML_SCHEMA_TYPE_IDC_KEY;
                    goto LAB_00199431;
                  }
                  if (((local_98->attrgrpDecl == (xmlHashTablePtr)0x0) ||
                      (iVar7 = xmlStrEqual(local_98->version,"keyref"), iVar7 == 0)) ||
                     (iVar7 = xmlStrEqual((xmlChar *)local_98->attrgrpDecl->dict,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0
                     )) goto LAB_001996f9;
                  local_50._0_4_ = XML_SCHEMA_TYPE_IDC_KEYREF;
                  bVar5 = true;
                  pxVar18 = pxVar11;
                }
                else {
                  local_50._0_4_ = XML_SCHEMA_TYPE_IDC_UNIQUE;
LAB_00199431:
                  bVar5 = false;
                }
                local_38 = *(_xmlSchemaType **)(__s + 2);
                local_40 = (_xmlSchemaType *)0x0;
                for (pxVar30 = (xmlDictPtr)local_98->notaDecl; pxVar30 != (xmlDictPtr)0x0;
                    pxVar30 = (xmlDictPtr)((xmlHashTablePtr)&pxVar30->seed)->table) {
                  if (pxVar30[1].table == (xmlDictEntry *)0x0) {
                    iVar7 = xmlStrEqual((xmlChar *)pxVar30->size,"id");
                    if (((iVar7 == 0) &&
                        (iVar7 = xmlStrEqual((xmlChar *)pxVar30->size,"name"), iVar7 == 0)) &&
                       ((pxVar26 = extraout_RDX_02, !bVar5 ||
                        (iVar7 = xmlStrEqual((xmlChar *)pxVar30->size,"refer"),
                        pxVar26 = extraout_RDX_03, iVar7 == 0)))) goto LAB_00199474;
                  }
                  else {
                    iVar7 = xmlStrEqual(*(xmlChar **)(pxVar30[1].table + 1),
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                    pxVar26 = extraout_RDX_01;
                    if (iVar7 != 0) {
LAB_00199474:
                      xmlSchemaPIllegalAttrErr
                                (pxVar29,(xmlParserErrors)pxVar30,pxVar26,(xmlAttrPtr)pxVar18);
                    }
                  }
                }
                pxVar29 = pxVar31;
                pxVar15 = xmlSchemaGetPropNode((xmlNodePtr)local_98,"name");
                if (pxVar15 == (xmlAttrPtr)0x0) {
                  pxVar31 = pxVar29;
                  xmlSchemaPMissingAttrErr
                            (pxVar29,(xmlParserErrors)local_98,(xmlSchemaBasicItemPtr)0x1cc014,
                             pxVar18,child,uri_00);
                }
                else {
                  pxVar17 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                  pxVar31 = pxVar29;
                  iVar7 = xmlSchemaPValAttrNode
                                    (pxVar29,(xmlSchemaBasicItemPtr)pxVar15,(xmlAttrPtr)pxVar17,
                                     (xmlSchemaTypePtr)&stack0xffffffffffffffc0,(xmlChar **)child);
                  p_Var10 = local_40;
                  if (iVar7 == 0) {
                    if (local_40 != (_xmlSchemaType *)0x0) {
                      pxVar18 = (xmlNodePtr)(*xmlMalloc)(0x50);
                      if (pxVar18 == (xmlNodePtr)0x0) {
                        xmlSchemaPErrMemory(pxVar29);
                      }
                      else {
                        pxVar18->last = (_xmlNode *)0x0;
                        pxVar18->parent = (_xmlNode *)0x0;
                        pxVar18->_private = (void *)0x0;
                        *(xmlSchemaAnnotPtr *)&pxVar18->type = (xmlSchemaAnnotPtr)0x0;
                        pxVar18->name = (xmlChar *)0x0;
                        pxVar18->children = (xmlNodePtr)0x0;
                        pxVar18->doc = (_xmlDoc *)0x0;
                        pxVar18->ns = (xmlNs *)0x0;
                        pxVar18->next = (_xmlNode *)0x0;
                        pxVar18->prev = (_xmlNode *)0x0;
                        pxVar18->parent = (_xmlNode *)local_38;
                        pxVar18->last = (_xmlNode *)p_Var10;
                        *(xmlSchemaTypeType *)&pxVar18->_private = (xmlSchemaTypeType)local_50;
                        pxVar18->children = (_xmlNode *)local_98;
                        pxVar25 = (xmlNodePtr)pxVar29->constructor;
                        iVar7 = xmlSchemaAddItemSize
                                          ((xmlSchemaItemListPtr *)&pxVar25->last->doc,5,pxVar18);
                        if (-1 < iVar7) {
                          if (bVar5) {
                            iVar7 = xmlSchemaAddItemSize(&pxVar29->constructor->pending,10,pxVar18);
                            pxVar27 = extraout_RDX_04;
                            if (iVar7 < 0) {
                              xmlSchemaPErrMemory(pxVar29);
                              pxVar27 = extraout_RDX_05;
                            }
                            xmlSchemaPValAttrID(pxVar29,(xmlNodePtr)local_98,pxVar27);
                            pxVar19 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)local_98,"refer")
                            ;
                            if (pxVar19 == (xmlNodePtr)0x0) {
                              xmlSchemaPMissingAttrErr
                                        (pxVar29,(xmlParserErrors)local_98,
                                         (xmlSchemaBasicItemPtr)0x1d0727,pxVar25,child,uri_00);
                            }
                            else {
                              pxVar20 = (xmlNs *)xmlSchemaNewQNameRef
                                                           (pxVar29,XML_SCHEMA_TYPE_IDC_KEY,
                                                            (xmlChar *)0x0,(xmlChar *)0x0);
                              pxVar18->ns = pxVar20;
                              pxVar25 = (xmlNodePtr)0x0;
                              if (pxVar20 == (xmlNs *)0x0) goto LAB_001996f9;
                              child = (char *)&pxVar20->_private;
                              uri_00 = (char *)&pxVar20->prefix;
                              pxVar15 = (xmlAttrPtr)xmlSchemaGetNodeContent(pxVar29,pxVar19);
                              xmlSchemaPValAttrNodeQNameValue
                                        (pxVar29,schema,(xmlSchemaBasicItemPtr)pxVar19,pxVar15,
                                         (xmlChar *)child,(xmlChar **)uri_00,
                                         in_stack_ffffffffffffff48);
                              xmlSchemaCheckReference
                                        (pxVar29,local_98,pxVar19,(xmlAttrPtr)pxVar18->ns->_private,
                                         (xmlChar *)child);
                            }
                          }
                          else {
                            xmlSchemaPValAttrID(pxVar29,(xmlNodePtr)local_98,name_01);
                          }
                          pxVar19 = (xmlNodePtr)local_98->id;
                          pxVar25 = pxVar18;
                          if (pxVar19 == (xmlNodePtr)0x0) {
LAB_00199957:
                            error = XML_SCHEMAP_S4S_ELEM_MISSING;
                            pxVar19 = (xmlNodePtr)0x0;
                            child = "A child element is missing";
                          }
                          else {
                            if (((pxVar19->ns != (xmlNs *)0x0) &&
                                (iVar7 = xmlStrEqual(pxVar19->name,(xmlChar *)"annotation"),
                                iVar7 != 0)) &&
                               (iVar7 = xmlStrEqual(pxVar19->ns->href,
                                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                               iVar7 != 0)) {
                              pxVar21 = xmlSchemaParseAnnotation(pxVar29,pxVar19,1);
                              *(xmlSchemaAnnotPtr *)&pxVar18->type = pxVar21;
                              pxVar19 = pxVar19->next;
                              if (pxVar19 == (_xmlNode *)0x0) goto LAB_00199957;
                            }
                            if (((pxVar19->ns != (xmlNs *)0x0) &&
                                (iVar7 = xmlStrEqual(pxVar19->name,(xmlChar *)"selector"),
                                iVar7 != 0)) &&
                               (iVar7 = xmlStrEqual(pxVar19->ns->href,
                                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                               iVar7 != 0)) {
                              p_Var22 = (_xmlNode *)
                                        xmlSchemaParseIDCSelectorAndField
                                                  (pxVar29,(xmlSchemaIDCPtr_conflict)pxVar18,pxVar19
                                                   ,0);
                              pxVar18->next = p_Var22;
                              pxVar19 = pxVar19->next;
                              if (pxVar19 == (xmlNodePtr)0x0) {
                                pxVar19 = (xmlNodePtr)0x0;
                              }
                              else {
                                pxVar29 = pxVar31;
                                if (((pxVar19->ns == (xmlNs *)0x0) ||
                                    (iVar7 = xmlStrEqual(pxVar19->name,(xmlChar *)"field"),
                                    pxVar29 = pxVar31, iVar7 == 0)) ||
                                   (iVar7 = xmlStrEqual(pxVar19->ns->href,
                                                        (xmlChar *)
                                                        "http://www.w3.org/2001/XMLSchema"),
                                   iVar7 == 0)) {
                                  pxVar31 = pxVar29;
                                  xmlSchemaPContentErr
                                            (pxVar29,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                                             (xmlSchemaBasicItemPtr)local_98,pxVar19,(xmlNodePtr)0x0
                                             ,"(annotation?, (selector, field+))",
                                             (char *)in_stack_ffffffffffffff48);
                                }
                                else {
                                  local_38 = (_xmlSchemaType *)&pxVar18->prev;
                                  local_50 = (_xmlSchemaType *)0x0;
                                  pxVar31 = pxVar29;
                                  do {
                                    p_Var10 = (_xmlSchemaType *)
                                              xmlSchemaParseIDCSelectorAndField
                                                        (pxVar29,(xmlSchemaIDCPtr_conflict)pxVar18,
                                                         pxVar19,1);
                                    if (p_Var10 != (_xmlSchemaType *)0x0) {
                                      iVar7 = *(int *)&pxVar18->doc;
                                      *(int *)&p_Var10->name = iVar7;
                                      *(int *)&pxVar18->doc = iVar7 + 1;
                                      if (local_50 == (_xmlSchemaType *)0x0) {
                                        local_50 = local_38;
                                      }
                                      *(_xmlSchemaType **)local_50 = p_Var10;
                                      local_50 = p_Var10;
                                    }
                                    pxVar19 = pxVar19->next;
                                    if (pxVar19 == (xmlNodePtr)0x0) goto LAB_001996f9;
                                  } while (((pxVar19->ns != (xmlNs *)0x0) &&
                                           (iVar7 = xmlStrEqual(pxVar19->name,(xmlChar *)"field"),
                                           iVar7 != 0)) &&
                                          (iVar7 = xmlStrEqual(pxVar19->ns->href,
                                                               (xmlChar *)
                                                               "http://www.w3.org/2001/XMLSchema"),
                                          iVar7 != 0));
                                }
                              }
                            }
                            error = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
                            child = (char *)0x0;
                          }
                          uri_00 = "(annotation?, (selector, field+))";
                          xmlSchemaPContentErr
                                    (pxVar29,error,(xmlSchemaBasicItemPtr)local_98,pxVar19,
                                     (xmlNodePtr)child,"(annotation?, (selector, field+))",
                                     (char *)in_stack_ffffffffffffff48);
                          goto LAB_001996f9;
                        }
                        pxVar29->nberrors = pxVar29->nberrors + 1;
                        pxVar29->err = 2;
                        child = (char *)0x0;
                        xmlRaiseMemoryError(pxVar29->serror,pxVar29->error,pxVar29->errCtxt,0x10,
                                            (xmlError *)0x0);
                        (*xmlFree)(pxVar18);
                      }
                    }
                    pxVar25 = (xmlNodePtr)0x0;
                    goto LAB_001996f9;
                  }
                }
                pxVar25 = (xmlNodePtr)0x0;
              }
LAB_001996f9:
              pxVar24 = (xmlSchemaParticlePtr)&pxVar11->name;
              if (pxVar11 == (xmlNodePtr)0x0) {
                pxVar24 = __s + 4;
              }
              *(xmlNodePtr *)pxVar24 = pxVar25;
              local_98 = *(xmlSchemaPtr *)&local_98->flags;
              pxVar11 = pxVar25;
            } while (local_98 != (xmlSchemaPtr)0x0);
LAB_001999f0:
            *(xmlSchemaTreeItemPtr *)(__s + 1) = pxVar12;
            if (topLevel != 0) {
              return (xmlSchemaBasicItemPtr)__s;
            }
            local_58->children = (xmlSchemaTreeItemPtr_conflict)__s;
            return (xmlSchemaBasicItemPtr)local_58;
          }
          xmlSchemaPErrMemory(pxVar29);
          (*xmlFree)(__s);
        }
      }
    }
  }
  if (pxVar12 == (xmlSchemaTreeItemPtr)0x0) {
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  if (local_58 != (xmlSchemaParticlePtr)0x0) {
    local_58->annot = (xmlSchemaAnnotPtr)0x0;
  }
LAB_00198bfa:
  plVar28 = *(long **)pxVar12;
  (*xmlFree)(pxVar12);
  if (plVar28 == (long *)0x0) {
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  do {
    plVar2 = (long *)*plVar28;
    (*xmlFree)(plVar28);
    plVar28 = plVar2;
  } while (plVar2 != (long *)0x0);
  return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaParseElement(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      xmlNodePtr node, int *isElemRef, int topLevel)
{
    xmlSchemaElementPtr decl = NULL;
    xmlSchemaParticlePtr particle = NULL;
    xmlSchemaAnnotPtr annot = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr, nameAttr;
    int min, max, isRef = 0;
    xmlChar *des = NULL;

    /* 3.3.3 Constraints on XML Representations of Element Declarations */
    /* TODO: Complete implementation of 3.3.6 */

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (isElemRef != NULL)
	*isElemRef = 0;
    /*
    * If we get a "ref" attribute on a local <element> we will assume it's
    * a reference - even if there's a "name" attribute; this seems to be more
    * robust.
    */
    nameAttr = xmlSchemaGetPropNode(node, "name");
    attr = xmlSchemaGetPropNode(node, "ref");
    if ((topLevel) || (attr == NULL)) {
	if (nameAttr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node, "name", NULL);
	    return (NULL);
	}
    } else
	isRef = 1;

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    /*
    * Skip particle part if a global declaration.
    */
    if (topLevel)
	goto declaration_part;
    /*
    * The particle part ==================================================
    */
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1, "(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
	goto return_null;

    /* ret->flags |= XML_SCHEMAS_ELEM_REF; */

    if (isRef) {
	const xmlChar *refNs = NULL, *ref = NULL;
	xmlSchemaQNameRefPtr refer = NULL;
	/*
	* The reference part =============================================
	*/
	if (isElemRef != NULL)
	    *isElemRef = 1;

	xmlSchemaPValAttrNodeQName(ctxt, schema,
	    NULL, attr, &refNs, &ref);
	xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
	/*
	* SPEC (3.3.3 : 2.1) "One of ref or name must be present, but not both"
	*/
	if (nameAttr != NULL) {
	    xmlSchemaPMutualExclAttrErr(ctxt,
		XML_SCHEMAP_SRC_ELEMENT_2_1, NULL, nameAttr, "ref", "name");
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (xmlStrEqual(attr->name, BAD_CAST "ref") ||
		    xmlStrEqual(attr->name, BAD_CAST "name") ||
		    xmlStrEqual(attr->name, BAD_CAST "id") ||
		    xmlStrEqual(attr->name, BAD_CAST "maxOccurs") ||
		    xmlStrEqual(attr->name, BAD_CAST "minOccurs"))
		{
		    attr = attr->next;
		    continue;
		} else {
		    /* SPEC (3.3.3 : 2.2) */
		    xmlSchemaPCustomAttrErr(ctxt,
			XML_SCHEMAP_SRC_ELEMENT_2_2,
			NULL, NULL, attr,
			"Only the attributes 'minOccurs', 'maxOccurs' and "
			"'id' are allowed in addition to 'ref'");
		    break;
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* No children except <annotation> expected.
	*/
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL, "(annotation?)");
	}
	if ((min == 0) && (max == 0))
	    goto return_null;
	/*
	* Create the reference item and attach it to the particle.
	*/
	refer = xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_ELEMENT,
	    ref, refNs);
	if (refer == NULL)
	    goto return_null;
	particle->children = (xmlSchemaTreeItemPtr) refer;
	particle->annot = annot;
	/*
	* Add the particle to pending components, since the reference
	* need to be resolved.
	*/
	WXS_ADD_PENDING(ctxt, particle);
	return ((xmlSchemaBasicItemPtr) particle);
    }
    /*
    * The declaration part ===============================================
    */
declaration_part:
    {
	const xmlChar *ns = NULL, *fixed, *name, *attrValue;
	xmlSchemaIDCPtr curIDC = NULL, lastIDC = NULL;

	if (xmlSchemaPValAttrNode(ctxt, NULL, nameAttr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0)
	    goto return_null;
	/*
	* Evaluate the target namespace.
	*/
	if (topLevel) {
	    ns = ctxt->targetNamespace;
	} else {
	    attr = xmlSchemaGetPropNode(node, "form");
	    if (attr != NULL) {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlStrEqual(attrValue, BAD_CAST "qualified")) {
		    ns = ctxt->targetNamespace;
		} else if (!xmlStrEqual(attrValue, BAD_CAST "unqualified")) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(qualified | unqualified)",
			attrValue, NULL, NULL, NULL);
		}
	    } else if (schema->flags & XML_SCHEMAS_QUALIF_ELEM)
		ns = ctxt->targetNamespace;
	}
	decl = xmlSchemaAddElement(ctxt, name, ns, node, topLevel);
	if (decl == NULL) {
	    goto return_null;
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "type")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "default")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "fixed")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "block")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "nillable")))
		{
		    if (topLevel == 0) {
			if ((!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "form")))
			{
			    xmlSchemaPIllegalAttrErr(ctxt,
				XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
			}
		    } else if ((!xmlStrEqual(attr->name, BAD_CAST "final")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "abstract")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "substitutionGroup"))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {

		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Extract/validate attributes.
	*/
	if (topLevel) {
	    /*
	    * Process top attributes of global element declarations here.
	    */
	    decl->flags |= XML_SCHEMAS_ELEM_GLOBAL;
	    decl->flags |= XML_SCHEMAS_ELEM_TOPLEVEL;
	    xmlSchemaPValAttrQName(ctxt, schema,
		NULL, node, "substitutionGroup",
		&(decl->substGroupNs), &(decl->substGroup));
	    if (xmlGetBooleanProp(ctxt, node, "abstract", 0))
		decl->flags |= XML_SCHEMAS_ELEM_ABSTRACT;
	    /*
	    * Attribute "final".
	    */
	    attr = xmlSchemaGetPropNode(node, "final");
	    if (attr == NULL) {
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_EXTENSION;
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_RESTRICTION;
	    } else {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		    -1,
		    XML_SCHEMAS_ELEM_FINAL_EXTENSION,
		    XML_SCHEMAS_ELEM_FINAL_RESTRICTION, -1, -1, -1) != 0) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(#all | List of (extension | restriction))",
			attrValue, NULL, NULL, NULL);
		}
	    }
	}
	/*
	* Attribute "block".
	*/
	attr = xmlSchemaGetPropNode(node, "block");
	if (attr == NULL) {
	    /*
	    * Apply default "block" values.
	    */
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_EXTENSION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_SUBSTITUTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION;
	} else {
	    attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		-1,
		XML_SCHEMAS_ELEM_BLOCK_EXTENSION,
		XML_SCHEMAS_ELEM_BLOCK_RESTRICTION,
		XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION, -1, -1) != 0) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    NULL, "(#all | List of (extension | "
		    "restriction | substitution))", attrValue,
		    NULL, NULL, NULL);
	    }
	}
	if (xmlGetBooleanProp(ctxt, node, "nillable", 0))
	    decl->flags |= XML_SCHEMAS_ELEM_NILLABLE;

	attr = xmlSchemaGetPropNode(node, "type");
	if (attr != NULL) {
	    xmlSchemaPValAttrNodeQName(ctxt, schema,
		NULL, attr,
		&(decl->namedTypeNs), &(decl->namedType));
	    xmlSchemaCheckReference(ctxt, schema, node,
		attr, decl->namedTypeNs);
	}
	decl->value = xmlSchemaGetProp(ctxt, node, "default");
	attr = xmlSchemaGetPropNode(node, "fixed");
	if (attr != NULL) {
	    fixed = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (decl->value != NULL) {
		/*
		* 3.3.3 : 1
		* default and fixed must not both be present.
		*/
		xmlSchemaPMutualExclAttrErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_1,
		    NULL, attr, "default", "fixed");
	    } else {
		decl->flags |= XML_SCHEMAS_ELEM_FIXED;
		decl->value = fixed;
	    }
	}
	/*
	* And now for the children...
	*/
	if (IS_SCHEMA(child, "complexType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are mutually
	    * exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <complexType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseComplexType(ctxt, schema, child, 0);
	    child = child->next;
	} else if (IS_SCHEMA(child, "simpleType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are
	    * mutually exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <simpleType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseSimpleType(ctxt, schema, child, 0);
	    child = child->next;
	}
	while ((IS_SCHEMA(child, "unique")) ||
	    (IS_SCHEMA(child, "key")) || (IS_SCHEMA(child, "keyref"))) {
	    if (IS_SCHEMA(child, "unique")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_UNIQUE, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "key")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEY, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "keyref")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEYREF, decl->targetNamespace);
	    }
	    if (lastIDC != NULL)
		lastIDC->next = curIDC;
	    else
		decl->idcs = (void *) curIDC;
	    lastIDC = curIDC;
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child,
		NULL, "(annotation?, ((simpleType | complexType)?, "
		"(unique | key | keyref)*))");
	}
	decl->annot = annot;
    }
    /*
    * NOTE: Element Declaration Representation OK 4. will be checked at a
    * different layer.
    */
    FREE_AND_NULL(des)
    if (topLevel)
	return ((xmlSchemaBasicItemPtr) decl);
    else {
	particle->children = (xmlSchemaTreeItemPtr) decl;
	return ((xmlSchemaBasicItemPtr) particle);
    }

return_null:
    FREE_AND_NULL(des);
    if (annot != NULL) {
	if (particle != NULL)
	    particle->annot = NULL;
	if (decl != NULL)
	    decl->annot = NULL;
	xmlSchemaFreeAnnot(annot);
    }
    return (NULL);
}